

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::reportInfeasibility(HighsSimplexAnalysis *this,bool header)

{
  type pbVar1;
  byte in_SIL;
  long in_RDI;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string *psVar2;
  string local_80 [32];
  string local_60 [48];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    if ((-1 < *(int *)(in_RDI + 0x1a0)) && (*(double *)(in_RDI + 0x1a8) < INFINITY)) {
      if (*(int *)(in_RDI + 0x100) == 1) {
        pbVar1 = std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(in_stack_ffffffffffffff50);
        highsFormatToString_abi_cxx11_
                  (*(char **)(in_RDI + 0x1a8),local_30," Ph1: %d(%g)",
                   (ulong)*(uint *)(in_RDI + 0x1a0));
        std::operator<<((ostream *)(pbVar1 + 0x10),local_30);
        std::__cxx11::string::~string(local_30);
      }
      else {
        pbVar1 = std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(in_stack_ffffffffffffff50);
        highsFormatToString_abi_cxx11_
                  (*(char **)(in_RDI + 0x1a8),local_60," Pr: %d(%g)",
                   (ulong)*(uint *)(in_RDI + 0x1a0));
        std::operator<<((ostream *)(pbVar1 + 0x10),local_60);
        std::__cxx11::string::~string(local_60);
      }
      if (0.0 < *(double *)(in_RDI + 0x1b0)) {
        pbVar1 = std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(in_stack_ffffffffffffff50);
        psVar2 = local_80;
        highsFormatToString_abi_cxx11_
                  (*(char **)(in_RDI + 0x1b0),psVar2,"; Du: %d(%g)",(ulong)*(uint *)(in_RDI + 0x1a4)
                  );
        std::operator<<((ostream *)(pbVar1 + 0x10),psVar2);
        std::__cxx11::string::~string(local_80);
      }
    }
  }
  else {
    pbVar1 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff50);
    std::operator<<((ostream *)(pbVar1 + 0x10)," Infeasibilities num(sum)");
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportInfeasibility(const bool header) {
  if (header) {
    *analysis_log << " Infeasibilities num(sum)";
  } else {
    // Primal infeasibility information may not be known if dual ray
    // has proved primal infeasibility
    if (num_primal_infeasibility <= kHighsIllegalInfeasibilityCount ||
        sum_primal_infeasibility >= kHighsIllegalInfeasibilityMeasure)
      return;
    if (solve_phase == 1) {
      *analysis_log << highsFormatToString(" Ph1: %" HIGHSINT_FORMAT "(%g)",
                                           num_primal_infeasibility,
                                           sum_primal_infeasibility);
    } else {
      *analysis_log << highsFormatToString(" Pr: %" HIGHSINT_FORMAT "(%g)",
                                           num_primal_infeasibility,
                                           sum_primal_infeasibility);
    }
    if (sum_dual_infeasibility > 0) {
      *analysis_log << highsFormatToString("; Du: %" HIGHSINT_FORMAT "(%g)",
                                           num_dual_infeasibility,
                                           sum_dual_infeasibility);
    }
  }
}